

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_get_nested(void)

{
  kmp_info_t *pkVar1;
  kmp_info_t *thread;
  
  pkVar1 = __kmp_entry_thread();
  return (uint)((((pkVar1->th).th_current_task)->td_icvs).nested != '\0');
}

Assistant:

int FTN_STDCALL
xexpand(FTN_GET_NESTED)( void )
{
    #ifdef KMP_STUB
        return __kmps_get_nested();
    #else
        kmp_info_t *thread;
        thread = __kmp_entry_thread();
        return get__nested( thread );
    #endif
}